

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfHuf.cpp
# Opt level: O0

int Imf_2_5::hufCompress(unsigned_short *raw,int nRaw,char *compressed)

{
  uint i;
  int iVar1;
  unsigned_long *freq_00;
  char **pcode;
  Int64 *hcode;
  AutoArray<unsigned_long,_65537> *this;
  char *in_RDX;
  int in_ESI;
  unsigned_short *in_RDI;
  int dataLength;
  int nBits;
  char *dataStart;
  int tableLength;
  char *tableEnd;
  char *tableStart;
  int iM;
  int im;
  AutoArray<unsigned_long,_65537> freq;
  int *in_stack_000000b0;
  int *in_stack_000000b8;
  Int64 *in_stack_000000c0;
  AutoArray<unsigned_long,_65537> *in_stack_ffffffffffffff70;
  AutoArray *this_00;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  int iVar2;
  AutoArray local_28 [8];
  char *local_20;
  int local_14;
  unsigned_short *local_10;
  int local_4;
  
  if (in_ESI == 0) {
    local_4 = 0;
  }
  else {
    this_00 = local_28;
    local_20 = in_RDX;
    local_14 = in_ESI;
    local_10 = in_RDI;
    AutoArray<unsigned_long,_65537>::AutoArray(in_stack_ffffffffffffff70);
    freq_00 = AutoArray::operator_cast_to_unsigned_long_(this_00);
    anon_unknown_0::countFrequencies(freq_00,local_10,local_14);
    pcode = (char **)AutoArray::operator_cast_to_unsigned_long_(local_28);
    anon_unknown_0::hufBuildEncTable(in_stack_000000c0,in_stack_000000b8,in_stack_000000b0);
    hcode = (Int64 *)(local_20 + 0x14);
    AutoArray::operator_cast_to_unsigned_long_(local_28);
    anon_unknown_0::hufPackEncTable(freq_00,(int)((ulong)this_00 >> 0x20),(int)this_00,pcode);
    this = (AutoArray<unsigned_long,_65537> *)AutoArray::operator_cast_to_unsigned_long_(local_28);
    i = anon_unknown_0::hufEncode
                  (hcode,(unsigned_short *)
                         CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                   (int)((ulong)freq_00 >> 0x20),(int)freq_00,(char *)this_00);
    iVar2 = (int)hcode;
    iVar1 = i + 7;
    if ((int)(i + 7) < 0) {
      iVar1 = i + 0xe;
    }
    iVar1 = iVar1 >> 3;
    anon_unknown_0::writeUInt(local_20,0);
    anon_unknown_0::writeUInt(local_20 + 4,0);
    anon_unknown_0::writeUInt(local_20 + 8,0);
    anon_unknown_0::writeUInt(local_20 + 0xc,i);
    anon_unknown_0::writeUInt(local_20 + 0x10,0);
    local_4 = (iVar2 + iVar1) - (int)local_20;
    AutoArray<unsigned_long,_65537>::~AutoArray(this);
  }
  return local_4;
}

Assistant:

int
hufCompress (const unsigned short raw[],
	     int nRaw,
	     char compressed[])
{
    if (nRaw == 0)
	return 0;

    AutoArray <Int64, HUF_ENCSIZE> freq;

    countFrequencies (freq, raw, nRaw);

    int im = 0;
    int iM = 0;
    hufBuildEncTable (freq, &im, &iM);

    char *tableStart = compressed + 20;
    char *tableEnd   = tableStart;
    hufPackEncTable (freq, im, iM, &tableEnd);
    int tableLength = tableEnd - tableStart;

    char *dataStart = tableEnd;
    int nBits = hufEncode (freq, raw, nRaw, iM, dataStart);
    int dataLength = (nBits + 7) / 8;

    writeUInt (compressed,      im);
    writeUInt (compressed +  4, iM);
    writeUInt (compressed +  8, tableLength);
    writeUInt (compressed + 12, nBits);
    writeUInt (compressed + 16, 0);	// room for future extensions

    return dataStart + dataLength - compressed;
}